

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.c
# Opt level: O3

void complex_multiply_add(float *dst,float *l,float *r,uint32_t size)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  
  if (size != 0) {
    uVar1 = 0;
    do {
      fVar2 = (float)*(undefined8 *)(r + uVar1);
      fVar3 = (float)((ulong)*(undefined8 *)(r + uVar1) >> 0x20);
      *(ulong *)(dst + uVar1) =
           CONCAT44((float)((ulong)*(undefined8 *)(dst + uVar1) >> 0x20) +
                    l[uVar1] * fVar3 + fVar2 * l[uVar1 + 1],
                    (float)*(undefined8 *)(dst + uVar1) + l[uVar1] * fVar2 + fVar3 * -l[uVar1 + 1]);
      uVar1 = uVar1 + 2;
    } while (uVar1 < size);
  }
  return;
}

Assistant:

VECTORIZE void complex_multiply_add(float *restrict dst, float *restrict l, float *restrict r, uint32_t size){
  for(uint32_t k = 0; k < size; k+= 2){
    float reA = l[k+0];
    float imA = l[k+1];
    float reB = r[k+0];
    float imB = r[k+1];

    float re = reA * reB - imA * imB;
    float im = reA * imB + imA * reB;

    dst[k+0] += re;
    dst[k+1] += im;
  }
}